

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushButtonRepeat(bool repeat)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  bool repeat_local;
  
  window._7_1_ = repeat;
  pIVar1 = GetCurrentWindow();
  (pIVar1->DC).ButtonRepeat = (bool)(window._7_1_ & 1);
  ImVector<bool>::push_back
            (&(pIVar1->DC).ButtonRepeatStack,(value_type_conflict1 *)((long)&window + 7));
  return;
}

Assistant:

void ImGui::PushButtonRepeat(bool repeat)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ButtonRepeat = repeat;
    window->DC.ButtonRepeatStack.push_back(repeat);
}